

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

void mcmrsrv(mcmcxdef *cctx,ushort siz,mcmon clinum,mclhd loadhd)

{
  mcmcx1def *ctx;
  mcmodef *pmVar1;
  mcmon glb;
  mcmon local_2a;
  
  ctx = cctx->mcmcxgl;
  pmVar1 = mcmoal(ctx,&local_2a);
  if (pmVar1 == (mcmodef *)0x0) {
    errsigf(ctx->mcmcxerr,"TADS",0xe);
  }
  (pmVar1->mcmoloc).mcmolocl = loadhd;
  pmVar1->mcmoflg = 0;
  pmVar1->mcmosiz = siz;
  mcmcliexp(cctx,clinum);
  if (cctx->mcmcxmtb[clinum >> 8][(ulong)clinum & 0xff] == 0xffff) {
    cctx->mcmcxmtb[clinum >> 8][(ulong)clinum & 0xff] = local_2a;
    return;
  }
  errsigf(ctx->mcmcxerr,"TADS",9);
}

Assistant:

void mcmrsrv(mcmcxdef *cctx, ushort siz, mcmon clinum, mclhd loadhd)
{
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      glb;                       /* global object number allocated */
    mcmodef   *o;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    o = mcmoal(ctx, &glb);                       /* get a new object header */
    if (!o) errsig(ctx->mcmcxerr, ERR_NOHDR);     /* can't get a new header */
    
    o->mcmoldh = loadhd;
    o->mcmoflg = 0;
    o->mcmosiz = siz;
    
    mcmcliexp(cctx, clinum);
    if (mcmc2g(cctx, clinum) != MCMONINV)
        errsig(ctx->mcmcxerr, ERR_CLIUSE);
    
    cctx->mcmcxmtb[clinum >> 8][clinum & 255] = glb;
}